

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualityProxy.cpp
# Opt level: O3

uint __thiscall Shell::EqualityProxy::getProxyPredicate(EqualityProxy *this)

{
  undefined1 *puVar1;
  Symbol *this_00;
  uint predicate;
  OperatorKey *key;
  OperatorType *type;
  Literal *pLVar2;
  Formula *pFVar3;
  undefined4 *puVar4;
  pointer pcVar5;
  Unit *this_01;
  InferenceStore *this_02;
  TermList *pTVar6;
  size_type extraout_RDX;
  void **head;
  void **head_2;
  void **head_1;
  initializer_list<Kernel::TermList> sorts;
  NonspecificInference0 local_a2;
  Literal *local_a0;
  Inference local_98;
  Inference local_68;
  
  if (this->_addedPred == true) {
    predicate = this->_proxyPredicate;
  }
  else {
    predicate = Kernel::Signature::addFreshPredicate(DAT_00b521b0,3,"sQ","eqProxy");
    this_00 = (DAT_00b521b0->_preds)._stack[predicate];
    local_68._0_8_ = 1;
    local_68._8_4_ = 1;
    local_68._age = 0;
    sorts._M_len = extraout_RDX;
    sorts._M_array = (iterator)0x2;
    key = Kernel::OperatorType::setupKey((OperatorType *)&local_68,sorts);
    *(undefined8 *)(key + 0x18) = 2;
    type = Kernel::OperatorType::getTypeFromKey(key,1);
    Kernel::Signature::Symbol::setType(this_00,type);
    puVar1 = &this_00->field_0x40;
    *(uint *)puVar1 = *(uint *)puVar1 | 0x40040;
    if (getProxyPredicate()::args == '\0') {
      getProxyPredicate();
    }
    getProxyPredicate::args._cursor = getProxyPredicate::args._stack;
    if (getProxyPredicate::args._stack == getProxyPredicate::args._end) {
      Lib::Stack<Kernel::TermList>::expand(&getProxyPredicate::args);
    }
    pTVar6 = getProxyPredicate::args._end;
    (getProxyPredicate::args._cursor)->_content = 1;
    getProxyPredicate::args._cursor = getProxyPredicate::args._cursor + 1;
    if (getProxyPredicate::args._cursor == pTVar6) {
      Lib::Stack<Kernel::TermList>::expand(&getProxyPredicate::args);
      pTVar6 = getProxyPredicate::args._end;
    }
    (getProxyPredicate::args._cursor)->_content = 5;
    getProxyPredicate::args._cursor = getProxyPredicate::args._cursor + 1;
    if (getProxyPredicate::args._cursor == pTVar6) {
      Lib::Stack<Kernel::TermList>::expand(&getProxyPredicate::args);
    }
    (getProxyPredicate::args._cursor)->_content = 9;
    getProxyPredicate::args._cursor = getProxyPredicate::args._cursor + 1;
    pLVar2 = Kernel::Literal::create(predicate,3,true,getProxyPredicate::args._stack);
    local_a0 = Kernel::Literal::createEquality(true,(TermList)0x5,(TermList)0x9,(TermList)0x1);
    pFVar3 = (Formula *)
             Lib::FixedSizeAllocator<64UL>::alloc
                       ((FixedSizeAllocator<64UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    puVar4 = (undefined4 *)
             Lib::FixedSizeAllocator<48UL>::alloc
                       ((FixedSizeAllocator<48UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    *puVar4 = 0;
    *(undefined4 **)(puVar4 + 2) = puVar4 + 6;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar4 + 2),Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
               DAT_00b50330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
    *(Literal **)(puVar4 + 10) = pLVar2;
    pcVar5 = (pointer)Lib::FixedSizeAllocator<48UL>::alloc
                                ((FixedSizeAllocator<48UL> *)
                                 (Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    pcVar5[0] = '\0';
    pcVar5[1] = '\0';
    pcVar5[2] = '\0';
    pcVar5[3] = '\0';
    *(pointer *)(pcVar5 + 8) = pcVar5 + 0x18;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pcVar5 + 8),Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
               DAT_00b50330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
    *(Literal **)(pcVar5 + 0x28) = local_a0;
    pFVar3->_connective = IFF;
    (pFVar3->_label)._M_dataplus._M_p = (pointer)&(pFVar3->_label).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pFVar3->_label,Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
               DAT_00b50330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
    *(undefined4 **)(pFVar3 + 1) = puVar4;
    pFVar3[1]._label._M_dataplus._M_p = pcVar5;
    pFVar3 = Kernel::Formula::quantify(pFVar3);
    this_01 = (Unit *)::operator_new(0x48,8);
    local_a2.inputType = AXIOM;
    local_a2.rule = EQUALITY_PROXY_AXIOM1;
    Kernel::Inference::Inference(&local_98,&local_a2);
    local_68._ptr2 = local_98._ptr2;
    local_68.th_ancestors = local_98.th_ancestors;
    local_68.all_ancestors = local_98.all_ancestors;
    local_68._splits = local_98._splits;
    local_68._ptr1 = local_98._ptr1;
    local_68._0_8_ = local_98._0_8_;
    local_68._8_4_ = local_98._8_4_;
    local_68._age = local_98._age;
    Kernel::Unit::Unit(this_01,FORMULA,&local_68);
    *(Formula **)(this_01 + 1) = pFVar3;
    *(undefined8 *)&this_01[1]._inference = 3;
    Kernel::Unit::doUnitTracing(this_01);
    this->_defUnit = this_01;
    this_02 = Kernel::InferenceStore::instance();
    Kernel::InferenceStore::recordIntroducedSymbol(this_02,this->_defUnit,PRED,predicate);
    this->_proxyPredicate = predicate;
    this->_addedPred = true;
  }
  return predicate;
}

Assistant:

unsigned EqualityProxy::getProxyPredicate()
{
  if(_addedPred){ return _proxyPredicate; }

  unsigned newPred = env.signature->addFreshPredicate(3,"sQ","eqProxy");

  TermList sort = TermList(0,false);
  TermList var1 = TermList(1,false);
  TermList var2 = TermList(2,false);

  Signature::Symbol* predSym = env.signature->getPredicate(newPred);
  OperatorType* predType = OperatorType::getPredicateType({sort, sort}, 1);
  predSym->setType(predType);
  predSym->markEqualityProxy();
  // don't need congruence axioms for the equality predicate itself
  predSym->markSkipCongruence();

  static TermStack args;
  args.reset();

  args.push(sort);
  args.push(var1);
  args.push(var2);

  Literal* proxyLit = Literal::create(newPred, 3, true, args.begin());
  Literal* eqLit = Literal::createEquality(true,var1,var2,sort);
  Formula* defForm = new BinaryFormula(IFF, new AtomicFormula(proxyLit), new AtomicFormula(eqLit));
  Formula* quantDefForm = Formula::quantify(defForm);

  _defUnit = new FormulaUnit(quantDefForm,NonspecificInference0(UnitInputType::AXIOM,InferenceRule::EQUALITY_PROXY_AXIOM1));

  InferenceStore::instance()->recordIntroducedSymbol(_defUnit, SymbolType::PRED, newPred);
  _proxyPredicate = newPred;
  _addedPred = true;
  return newPred;
}